

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

HaI32 __thiscall dgMeshEffect::GetTotalIndexCount(dgMeshEffect *this)

{
  HaI32 HVar1;
  dgEdge *pdVar2;
  HaI32 HVar3;
  Iterator local_28;
  
  local_28.m_tree = (dgTree<dgEdge,_long> *)this;
  HVar1 = dgPolyhedra::IncLRU(&this->super_dgPolyhedra);
  local_28.m_ptr = &dgTree<dgEdge,_long>::Minimum((dgTree<dgEdge,_long> *)this)->super_dgRedBackNode
  ;
  HVar3 = 0;
  while ((dgTreeNode *)local_28.m_ptr != (dgTreeNode *)0x0) {
    if ((((dgEdge *)((long)local_28.m_ptr + 0x28))->m_mark != HVar1) &&
       (-1 < ((dgEdge *)((long)local_28.m_ptr + 0x28))->m_incidentFace)) {
      pdVar2 = (dgEdge *)((long)local_28.m_ptr + 0x28);
      do {
        pdVar2->m_mark = HVar1;
        HVar3 = HVar3 + 1;
        pdVar2 = pdVar2->m_next;
      } while (pdVar2 != (dgEdge *)((long)local_28.m_ptr + 0x28));
    }
    dgTree<dgEdge,_long>::Iterator::operator++(&local_28,0);
  }
  return HVar3;
}

Assistant:

hacd::HaI32 dgMeshEffect::GetTotalIndexCount() const
{
	Iterator iter (*this);
	hacd::HaI32 count = 0;
	hacd::HaI32 mark = IncLRU();
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (edge->m_mark == mark) {
			continue;
		}

		if (edge->m_incidentFace < 0) {
			continue;
		}
		
		dgEdge* ptr = edge;
		do {
			count ++;
			ptr->m_mark = mark;
			ptr = ptr->m_next;
		} while (ptr != edge);
	}
	return count;
}